

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::search(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  uint uVar2;
  uint src_00;
  size_type sVar3;
  string Word2;
  string Word1;
  string local_70;
  string local_50;
  
  requireDStackDepth(this,4,"SEARCH");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  src_00 = ForthStack<unsigned_int>::getTop(this_00,2);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&local_50,src_00,(ulong)uVar2);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&local_70,src,(ulong)uVar1);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&local_50,local_70._M_dataplus._M_p,0,local_70._M_string_length);
  if (sVar3 == 0xffffffffffffffff) {
    ForthStack<unsigned_int>::setTop(this_00,this->False);
  }
  else {
    ForthStack<unsigned_int>::setTop(this_00,this->True);
    ForthStack<unsigned_int>::setTop(this_00,1,uVar2 - (int)sVar3);
    ForthStack<unsigned_int>::setTop(this_00,2,src_00 + (int)sVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void search(){
			REQUIRE_DSTACK_DEPTH(4, "SEARCH");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); 
			auto length1 = dStack.getTop(1); 
			auto caddr1 = CADDR(dStack.getTop(2)); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.find(Word2,0);
			if(result!=std::string::npos){
				dStack.setTop(True);
				dStack.setTop(1,length1-CELL(result));
				dStack.setTop(2,caddr1+CELL(result));

			} else {
				dStack.setTop(False);
				// dStack.setTop(1,length1); // not changed
				// dStack.setTop(2,caddr1);	 // not changed
			}
			
		}